

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O0

void __thiscall soplex::CLUFactorRational::initFactorRings(CLUFactorRational *this)

{
  long lVar1;
  pointer pnVar2;
  long *plVar3;
  long lVar4;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_RDI;
  Pring *ring;
  int *cperm;
  int *rperm;
  int i;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_24;
  undefined8 in_stack_ffffffffffffffe8;
  int n;
  Pring **in_stack_fffffffffffffff0;
  
  n = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  lVar1 = *(long *)((long)(in_RDI + 2) + 0x30);
  pnVar2 = (pointer)in_RDI[3].m_value.num.m_backend.
                    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    .m_data.la[0];
  spx_alloc<soplex::CLUFactorRational::Pring*>(in_stack_fffffffffffffff0,n);
  spx_alloc<soplex::CLUFactorRational::Pring*>(in_stack_fffffffffffffff0,n);
  spx_alloc<soplex::CLUFactorRational::Pring*>(in_stack_fffffffffffffff0,n);
  spx_alloc<soplex::CLUFactorRational::Pring*>(in_stack_fffffffffffffff0,n);
  for (local_24 = *(int *)((long)&(in_RDI->m_value).num.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + 4) -
                  *(int *)((long)&in_RDI[9].m_value.den.m_backend.
                                  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                  .m_data + 8); -1 < local_24; local_24 = local_24 + -1) {
    lVar4 = *(long *)((long)(in_RDI + 10) + 0x18) + (long)local_24 * 0x20;
    *(long *)(*(long *)((long)(in_RDI + 10) + 0x18) + (long)local_24 * 0x20) = lVar4;
    *(long *)(*(long *)((long)(in_RDI + 10) + 0x18) + 8 + (long)local_24 * 0x20) = lVar4;
    lVar4 = *(long *)((long)(in_RDI + 10) + 0x28) + (long)local_24 * 0x20;
    *(long *)(*(long *)((long)(in_RDI + 10) + 0x28) + (long)local_24 * 0x20) = lVar4;
    *(long *)(*(long *)((long)(in_RDI + 10) + 0x28) + 8 + (long)local_24 * 0x20) = lVar4;
  }
  local_24 = 0;
  do {
    if (*(int *)((long)&(in_RDI->m_value).num.m_backend.
                        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                        .m_data + 4) <= local_24) {
      return;
    }
    if (*(int *)(lVar1 + (long)local_24 * 4) < 0) {
      if (*(int *)(*(long *)&in_RDI[6].m_value.den.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_limbs + (long)local_24 * 4) < 1) {
        (in_RDI->m_value).num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.ld.capacity = 2;
        return;
      }
      plVar3 = (long *)(*(long *)((long)(in_RDI + 10) + 0x28) +
                       (long)*(int *)(*(long *)&in_RDI[6].m_value.den.m_backend.
                                                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                                .m_limbs + (long)local_24 * 4) * 0x20);
      *(long *)(*(long *)((long)(in_RDI + 10) + 0x20) + (long)local_24 * 0x20) = *plVar3;
      *(long *)(*(long *)(*(long *)((long)(in_RDI + 10) + 0x20) + (long)local_24 * 0x20) + 8) =
           *(long *)((long)(in_RDI + 10) + 0x20) + (long)local_24 * 0x20;
      *(long **)(*(long *)((long)(in_RDI + 10) + 0x20) + (long)local_24 * 0x20 + 8) = plVar3;
      *plVar3 = *(long *)((long)(in_RDI + 10) + 0x20) + (long)local_24 * 0x20;
      *(int *)(*(long *)((long)(in_RDI + 10) + 0x20) + (long)local_24 * 0x20 + 0x10) = local_24;
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)in_RDI,in_stack_ffffffffffffffac);
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=(in_RDI,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    }
    if (*(int *)((long)&(pnVar2->m_backend).m_value + (long)local_24 * 4) < 0) {
      if (*(int *)(in_RDI[9].m_value.den.m_backend.
                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                   .m_data.la[0] + (long)local_24 * 4) < 1) {
        (in_RDI->m_value).num.m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.ld.capacity = 2;
        return;
      }
      plVar3 = (long *)(*(long *)((long)(in_RDI + 10) + 0x18) +
                       (long)*(int *)(in_RDI[9].m_value.den.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data.la[0] + (long)local_24 * 4) * 0x20);
      *(long *)(*(long *)((long)(in_RDI + 10) + 0x10) + (long)local_24 * 0x20) = *plVar3;
      *(long *)(*(long *)(*(long *)((long)(in_RDI + 10) + 0x10) + (long)local_24 * 0x20) + 8) =
           *(long *)((long)(in_RDI + 10) + 0x10) + (long)local_24 * 0x20;
      *(long **)(*(long *)((long)(in_RDI + 10) + 0x10) + 8 + (long)local_24 * 0x20) = plVar3;
      *plVar3 = *(long *)((long)(in_RDI + 10) + 0x10) + (long)local_24 * 0x20;
      *(int *)(*(long *)((long)(in_RDI + 10) + 0x10) + 0x10 + (long)local_24 * 0x20) = local_24;
      *(undefined4 *)
       ((long)&(((pointer)
                in_RDI[9].m_value.num.m_backend.
                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                .m_data.la[0])->m_backend).m_value + (long)local_24 * 4) = 0;
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

inline void CLUFactorRational::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactorRational::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}